

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

QString * __thiscall
VcprojGenerator::retrievePlatformToolSet(QString *__return_storage_ptr__,VcprojGenerator *this)

{
  QMakeProject *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  ProKey local_f8;
  ProString local_c8;
  QStringBuilder<QString,_ProString> local_98;
  QArrayData *local_48;
  undefined1 *puStack_40;
  storage_type *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_48);
  if (local_38 == (storage_type *)0x0) {
    this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_f8,"MSVC_TOOLSET_VER");
    QMakeEvaluator::first(&local_c8,&this_00->super_QMakeEvaluator,&local_f8);
    local_98.a.d.d = (Data *)0x0;
    local_98.a.d.ptr = L"v";
    local_98.a.d.size = 1;
    ProString::ProString(&local_98.b,&local_c8);
    QStringBuilder<QString,_ProString>::convertTo<QString>(__return_storage_ptr__,&local_98);
    QStringBuilder<QString,_ProString>::~QStringBuilder(&local_98);
    if (&(local_c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QVar1.m_data = local_38;
    QVar1.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar1);
    (__return_storage_ptr__->d).d = local_98.a.d.d;
    (__return_storage_ptr__->d).ptr = local_98.a.d.ptr;
    (__return_storage_ptr__->d).size = local_98.a.d.size;
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::retrievePlatformToolSet() const
{
    // The PlatformToolset string corresponds to the name of a directory in
    // $(VCTargetsPath)\Platforms\{Win32,x64,...}\PlatformToolsets
    // e.g. v90, v100, v110, v110_xp, v120_CTP_Nov, v120, or WindowsSDK7.1

    // This environment variable may be set by a commandline build
    // environment such as the Windows SDK command prompt
    QByteArray envVar = qgetenv("PlatformToolset");
    if (!envVar.isEmpty())
        return envVar;

    return u"v"_s + project->first("MSVC_TOOLSET_VER");
}